

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void __thiscall CVmObjTads::load_image_props_and_scs(CVmObjTads *this,char *ptr,size_t siz)

{
  ushort uVar1;
  vm_prop_id_t prop;
  vm_tadsobj_hdr *this_00;
  long lVar2;
  vm_prop_id_t *pvVar3;
  short sVar4;
  bool bVar5;
  vm_val_t val;
  vm_val_t vStack_38;
  
  this_00 = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  uVar1 = *(ushort *)ptr;
  sVar4 = *(short *)(ptr + 2);
  for (lVar2 = 0; (ulong)uVar1 * 4 != lVar2; lVar2 = lVar2 + 4) {
    (&this_00->sc[0].id)[lVar2] = *(vm_obj_id_t *)(ptr + lVar2 + 6);
    *(undefined8 *)((long)&this_00->sc[0].objp + lVar2 * 4) = 0;
  }
  pvVar3 = (vm_prop_id_t *)(ptr + lVar2 + 6);
  while (bVar5 = sVar4 != 0, sVar4 = sVar4 + -1, bVar5) {
    prop = *pvVar3;
    vmb_get_dh((char *)(pvVar3 + 1),&vStack_38);
    vm_tadsobj_hdr::alloc_prop_entry(this_00,prop,&vStack_38,0);
    pvVar3 = (vm_prop_id_t *)((long)pvVar3 + 7);
  }
  return;
}

Assistant:

void CVmObjTads::load_image_props_and_scs(VMG_ const char *ptr, size_t siz)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* get the number of superclasses */
    ushort sc_cnt = osrp2(ptr);

    /* get the number of load image properties */
    ushort li_cnt = osrp2(ptr + 2);

    /* read the superclasses from the load image and store them */
    ushort i;
    const char *p;
    for (i = 0, p = ptr + 6 ; i < sc_cnt ; ++i, p += 4)
    {
        /* store the object ID */
        hdr->sc[i].id = (vm_obj_id_t)t3rp4u(p);

        /* 
         *   We can't store the superclass pointer yet, as the superclass
         *   object might not be loaded yet.  Store null for now; we'll fix
         *   this up in post_load_init() after all the other objects have
         *   been loaded.  
         */
        hdr->sc[i].objp = 0;
    }

    /* read the properties from the load image and store them */
    for (i = 0 ; i < li_cnt ; ++i, p += 2 + VMB_DATAHOLDER)
    {
        /* decode the property data */
        vm_prop_id_t prop = (vm_prop_id_t)osrp2(p);
        vm_val_t val;
        vmb_get_dh(p + 2, &val);

        /* store the property */
        hdr->alloc_prop_entry(prop, &val, 0);
    }
}